

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  char *pcVar1;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  char *__last;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  char_type buffer [13];
  char local_3d [13];
  
  bVar2 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  uVar10 = *(uint *)this;
  __last = local_3d + *(int *)(this + 4);
  pcVar1 = __last;
  if (uVar10 < 100) {
    bVar12 = false;
  }
  else {
    iVar6 = -1;
    uVar7 = 1;
    iVar8 = -2;
    uVar9 = 2;
    do {
      uVar4 = uVar10;
      uVar11 = (ulong)((uVar4 % 100) * 2);
      pcVar1[-1] = internal::basic_data<void>::DIGITS[uVar11 + 1];
      lVar5 = -1;
      if ((uVar7 / 3) * 3 + iVar6 == 0) {
        *(num_writer *)(pcVar1 + -2) = this[8];
        lVar5 = -2;
      }
      pcVar1[lVar5 + -1] = internal::basic_data<void>::DIGITS[uVar11];
      if ((int)(uVar9 / 3) * 3 + iVar8 == 0) {
        *(num_writer *)(pcVar1 + lVar5 + -2) = this[8];
        lVar5 = lVar5 + -2;
      }
      else {
        lVar5 = lVar5 + -1;
      }
      pcVar1 = pcVar1 + lVar5;
      iVar6 = iVar6 + -2;
      uVar7 = uVar7 + 2;
      iVar8 = iVar8 + -2;
      uVar9 = (ulong)((int)uVar9 + 2);
      uVar10 = uVar4 / 100;
    } while (9999 < uVar4);
    bVar12 = iVar6 + (uVar7 / 3) * 3 == 0;
    uVar10 = uVar4 / 100;
  }
  if (uVar10 < 10) {
    bVar3 = (byte)uVar10 | 0x30;
  }
  else {
    pcVar1[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar10 * 2 & 0xffffffff) + 1];
    lVar5 = -1;
    if (bVar12) {
      *(num_writer *)(pcVar1 + -2) = this[8];
      lVar5 = -2;
    }
    pcVar1 = pcVar1 + lVar5;
    bVar3 = internal::basic_data<void>::DIGITS[(ulong)uVar10 * 2];
  }
  pcVar1[-1] = bVar3;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (local_3d,__last,bVar2);
  it->container = (list<char,_std::allocator<char>_> *)bVar2;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }